

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_rowcol_blocked_sse41_128_32
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short *psVar1;
  __m128i alVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  __m128i *ptr;
  uint uVar7;
  __m128i *ptr_00;
  parasail_result_t *ppVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  __m128i *palVar19;
  int iVar20;
  __m128i *in_R11;
  uint uVar21;
  uint uVar22;
  size_t size;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar33;
  undefined1 auVar32 [16];
  uint uVar34;
  int iVar35;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined1 auVar36 [16];
  int iVar42;
  undefined1 auVar37 [16];
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i_32_t t;
  longlong local_98;
  longlong lStack_90;
  size_t local_80;
  char *local_78;
  __m128i *local_70;
  parasail_result_t *local_68;
  __m128i *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar23;
  
  uVar7 = s1Len + 3;
  uVar21 = s1Len + 6;
  if (-1 < (int)uVar7) {
    uVar21 = uVar7;
  }
  uVar22 = (int)uVar21 >> 2;
  uVar23 = (ulong)uVar22;
  local_78 = s2;
  ptr_00 = parasail_memalign___m128i(0x10,(long)(int)(uVar22 * 0x18));
  size = (size_t)(int)uVar22;
  local_60 = parasail_memalign___m128i(0x10,size);
  local_70 = parasail_memalign___m128i(0x10,size);
  local_48 = ZEXT416((uint)open);
  local_58 = ZEXT416((uint)gap);
  ppVar8 = parasail_result_new_rowcol1(uVar21 & 0xfffffffc,s2Len);
  ptr = local_60;
  uVar21 = 1;
  if (1 < (int)uVar22) {
    uVar21 = uVar22;
  }
  iVar11 = 0;
  lVar12 = 0;
  do {
    if (0 < s1Len) {
      lVar12 = (long)(int)lVar12;
      lVar13 = 0;
      uVar14 = 0;
      do {
        lVar16 = 0;
        lVar18 = lVar13;
        do {
          in_R11 = (__m128i *)0x0;
          if (lVar18 < s1Len) {
            in_R11 = (__m128i *)
                     (ulong)(uint)matrix->matrix
                                  [(long)matrix->mapper[(byte)s1[lVar18]] * (long)matrix->size];
          }
          *(int *)((long)&local_98 + lVar16) = (int)in_R11;
          lVar18 = lVar18 + 1;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        alVar2[1] = lStack_90;
        alVar2[0] = local_98;
        ptr_00[lVar12] = alVar2;
        lVar12 = lVar12 + 1;
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 4;
      } while (uVar14 != uVar21);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x18);
  if (-1 < s1Len) {
    uVar7 = s1Len;
  }
  if (0 < s1Len) {
    uVar9 = 1;
    if (1 < (int)uVar22) {
      uVar9 = uVar23;
    }
    uVar10 = 0;
    do {
      lVar12 = 0;
      do {
        *(int *)((long)&local_98 + lVar12 * 4) = -open;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      local_60[uVar10] = (__m128i)0x0;
      local_70[uVar10][0] = local_98;
      local_70[uVar10][1] = lStack_90;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  if (s2Len < 1) {
    auVar25 = (undefined1  [16])0x0;
  }
  else {
    iVar11 = s1Len - (uVar7 & 0xfffffffc);
    uVar9 = 1;
    if (1 < (int)uVar22) {
      uVar9 = uVar23;
    }
    uVar10 = 0;
    auVar25 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar15 = matrix->mapper[(byte)local_78[uVar10]];
        auVar32 = (undefined1  [16])0x0;
        uVar17 = 0;
        auVar26 = auVar25;
        uVar21 = 0xc0000000;
        do {
          alVar2 = local_60[uVar17];
          palVar19 = local_70 + uVar17;
          iVar28 = (int)(*palVar19)[0];
          iVar29 = *(int *)((long)*palVar19 + 4);
          iVar30 = (int)(*palVar19)[1];
          iVar31 = *(int *)((long)*palVar19 + 0xc);
          auVar36._0_8_ = alVar2[0] << 0x20;
          auVar36._8_8_ = alVar2[1] << 0x20 | alVar2[0] >> 0x20;
          auVar36 = auVar36 | auVar32;
          palVar19 = ptr_00 + (long)iVar15 * size + uVar17;
          iVar35 = auVar36._0_4_ + (int)(*palVar19)[0];
          iVar38 = auVar36._4_4_ + *(int *)((long)*palVar19 + 4);
          iVar40 = auVar36._8_4_ + (int)(*palVar19)[1];
          iVar42 = auVar36._12_4_ + *(int *)((long)*palVar19 + 0xc);
          iVar43 = (uint)(-1 < iVar28) * iVar28;
          iVar20 = (uint)(-1 < iVar29) * iVar29;
          iVar41 = (uint)(-1 < iVar30) * iVar30;
          iVar39 = (uint)(-1 < iVar31) * iVar31;
          uVar7 = (uint)(iVar43 < iVar35) * iVar35 | (uint)(iVar43 >= iVar35) * iVar43;
          uVar14 = (uint)(iVar20 < iVar38) * iVar38 | (uint)(iVar20 >= iVar38) * iVar20;
          uVar33 = (uint)(iVar41 < iVar40) * iVar40 | (uint)(iVar41 >= iVar40) * iVar41;
          uVar34 = (uint)(iVar39 < iVar42) * iVar42 | (uint)(iVar39 >= iVar42) * iVar39;
          auVar32._0_4_ = uVar21 - local_48._0_4_;
          auVar32._4_4_ = uVar7 - local_48._0_4_;
          auVar32._8_4_ = uVar14 - local_48._0_4_;
          auVar32._12_4_ = uVar33 - local_48._0_4_;
          auVar44._0_4_ = -(uint)(0 < auVar32._0_4_);
          auVar44._4_4_ = -(uint)(0 < auVar32._4_4_);
          auVar44._8_4_ = -(uint)(0 < auVar32._8_4_);
          auVar44._12_4_ = -(uint)(0 < auVar32._12_4_);
          iVar20 = movmskps((int)in_R11,auVar44);
          bVar24 = iVar20 != 0;
          uVar21 = uVar34;
          auVar45 = auVar32;
          if (bVar24) {
            while( true ) {
              iVar39 = auVar45._0_4_;
              iVar41 = auVar45._4_4_;
              iVar43 = auVar45._8_4_;
              iVar35 = auVar45._12_4_;
              if (!bVar24) break;
              iVar38 = -local_58._0_4_;
              auVar37._4_4_ = auVar32._0_4_ - local_58._0_4_;
              auVar37._0_4_ = iVar38;
              auVar37._8_4_ = auVar32._4_4_ - local_58._0_4_;
              auVar37._12_4_ = auVar32._8_4_ - local_58._0_4_;
              auVar45._0_4_ = (uint)(iVar39 < iVar38) * iVar38 | (uint)(iVar39 >= iVar38) * iVar39;
              auVar45._4_4_ =
                   (uint)(iVar41 < auVar37._4_4_) * auVar37._4_4_ |
                   (uint)(iVar41 >= auVar37._4_4_) * iVar41;
              auVar45._8_4_ =
                   (uint)(iVar43 < auVar37._8_4_) * auVar37._8_4_ |
                   (uint)(iVar43 >= auVar37._8_4_) * iVar43;
              auVar45._12_4_ =
                   (uint)(iVar35 < auVar37._12_4_) * auVar37._12_4_ |
                   (uint)(iVar35 >= auVar37._12_4_) * iVar35;
              auVar46._0_4_ = -(uint)((int)local_58._0_4_ < 0);
              auVar46._4_4_ = -(uint)(0 < auVar37._4_4_);
              auVar46._8_4_ = -(uint)(0 < auVar37._8_4_);
              auVar46._12_4_ = -(uint)(0 < auVar37._12_4_);
              iVar20 = movmskps(iVar20,auVar46);
              bVar24 = iVar20 != 0;
              auVar32 = auVar37;
            }
            uVar7 = (uint)((int)uVar7 < iVar39) * iVar39 | ((int)uVar7 >= iVar39) * uVar7;
            uVar14 = (uint)((int)uVar14 < iVar41) * iVar41 | ((int)uVar14 >= iVar41) * uVar14;
            uVar33 = (uint)((int)uVar33 < iVar43) * iVar43 | ((int)uVar33 >= iVar43) * uVar33;
            uVar34 = (uint)((int)uVar34 < iVar35) * iVar35 | ((int)uVar34 >= iVar35) * uVar34;
            iVar35 = iVar35 + (local_48._0_4_ - local_58._0_4_);
            uVar21 = (iVar35 < (int)uVar34) * uVar34 | (uint)(iVar35 >= (int)uVar34) * iVar35;
          }
          in_R11 = local_60 + uVar17;
          palVar19 = local_70 + uVar17;
          auVar32 = (undefined1  [16])alVar2 >> 0x60;
          *(uint *)*in_R11 = uVar7;
          *(uint *)((long)*in_R11 + 4) = uVar14;
          *(uint *)(*in_R11 + 1) = uVar33;
          *(uint *)((long)*in_R11 + 0xc) = uVar34;
          iVar20 = auVar26._0_4_;
          auVar25._0_4_ = (iVar20 < (int)uVar7) * uVar7 | (uint)(iVar20 >= (int)uVar7) * iVar20;
          iVar20 = auVar26._4_4_;
          auVar25._4_4_ = (iVar20 < (int)uVar14) * uVar14 | (uint)(iVar20 >= (int)uVar14) * iVar20;
          iVar20 = auVar26._8_4_;
          iVar39 = auVar26._12_4_;
          auVar25._8_4_ = (iVar20 < (int)uVar33) * uVar33 | (uint)(iVar20 >= (int)uVar33) * iVar20;
          auVar25._12_4_ = (iVar39 < (int)uVar34) * uVar34 | (uint)(iVar39 >= (int)uVar34) * iVar39;
          iVar20 = uVar7 - local_48._0_4_;
          iVar39 = uVar14 - local_48._0_4_;
          iVar41 = uVar33 - local_48._0_4_;
          iVar43 = uVar34 - local_48._0_4_;
          iVar28 = iVar28 - local_58._0_4_;
          iVar29 = iVar29 - local_58._0_4_;
          iVar30 = iVar30 - local_58._0_4_;
          iVar31 = iVar31 - local_58._0_4_;
          *(uint *)*palVar19 = (uint)(iVar28 < iVar20) * iVar20 | (uint)(iVar28 >= iVar20) * iVar28;
          *(uint *)((long)*palVar19 + 4) =
               (uint)(iVar29 < iVar39) * iVar39 | (uint)(iVar29 >= iVar39) * iVar29;
          *(uint *)(*palVar19 + 1) =
               (uint)(iVar30 < iVar41) * iVar41 | (uint)(iVar30 >= iVar41) * iVar30;
          *(uint *)((long)*palVar19 + 0xc) =
               (uint)(iVar31 < iVar43) * iVar43 | (uint)(iVar31 >= iVar43) * iVar31;
          uVar17 = uVar17 + 1;
          auVar26 = auVar25;
        } while (uVar17 != uVar9);
      }
      uVar17 = local_60[size - 1][0];
      uVar27 = local_60[size - 1][1];
      iVar15 = iVar11;
      if (0 < iVar11) {
        do {
          uVar27 = uVar27 << 0x10 | uVar17 >> 0x30;
          iVar15 = iVar15 + -1;
          uVar17 = uVar17 << 0x10;
        } while (iVar15 != 0);
      }
      ((ppVar8->field_4).rowcols)->score_row[uVar10] = (int)(short)(uVar27 >> 0x30);
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)s2Len);
  }
  if (0 < s1Len) {
    uVar9 = 1;
    if (1 < (int)uVar22) {
      uVar9 = uVar23;
    }
    lVar12 = 0;
    do {
      psVar1 = (short *)((long)*local_60 + lVar12);
      sVar4 = psVar1[1];
      sVar5 = psVar1[2];
      sVar6 = psVar1[3];
      piVar3 = ((ppVar8->field_4).rowcols)->score_col;
      *(int *)((long)piVar3 + lVar12) = (int)*psVar1;
      *(int *)((long)piVar3 + lVar12 + 4) = (int)sVar4;
      *(int *)((long)piVar3 + lVar12 + 8) = (int)sVar5;
      *(int *)((long)piVar3 + lVar12 + 0xc) = (int)sVar6;
      lVar12 = lVar12 + 0x10;
    } while (uVar9 * 0x10 != lVar12);
  }
  iVar11 = -0x40000000;
  iVar15 = 4;
  do {
    uVar23 = auVar25._0_8_;
    lVar12 = auVar25._8_8_;
    if (iVar11 < auVar25._12_4_) {
      iVar11 = auVar25._12_4_;
    }
    auVar25._0_8_ = uVar23 << 0x20;
    auVar25._8_8_ = lVar12 << 0x20 | uVar23 >> 0x20;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  ppVar8->score = iVar11;
  ppVar8->flag = ppVar8->flag | 0x8242004;
  local_80 = size;
  local_68 = ppVar8;
  parasail_free(local_70);
  parasail_free(ptr);
  parasail_free(ptr_00);
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 4; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_32;
    __m128i vGapO = _mm_set1_epi32(open);
    __m128i vGapE = _mm_set1_epi32(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi32(NEG_INF_32);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_32_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 12); /* rshift 3 */
            vH = _mm_slli_si128(vH, 4); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi32(vH, vP);
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vZero);

            vF = _mm_srli_si128(vF, 12);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 4));
            vF = _mm_sub_epi32(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi32(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi32(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 4);
                    vT2 = _mm_sub_epi32(vT2, vGapE);
                    vF = _mm_max_epi32(vF, vT2);
                }
                vH = _mm_max_epi32(vH, vF);
                vF = _mm_add_epi32(vF, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                vF = _mm_max_epi32(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vMaxH, vH);

            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int32_t value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}